

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::VarintCasesWithSizes_WriteVarint64_Test::TestBody
          (VarintCasesWithSizes_WriteVarint64_Test *this)

{
  size_t *lhs;
  bool bVar1;
  ParamType *pPVar2;
  ParamType *pPVar3;
  int64_t iVar4;
  ulong uVar5;
  ulong uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint8_t *ptr;
  pointer *__ptr;
  char *pcVar8;
  char *in_R9;
  pointer *__ptr_2;
  void *data;
  CodedOutputStream coded_output;
  ArrayOutputStream output;
  AssertHelper local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  AssertHelper local_90;
  undefined1 local_88 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  ArrayOutputStream *local_58;
  undefined2 local_50;
  bool local_4e;
  bool local_4d;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  int64_t local_40;
  ArrayOutputStream local_38;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  pPVar3 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  ArrayOutputStream::ArrayOutputStream
            (&local_38,&io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,
             (pPVar3->
             super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
             super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl);
  local_4e = (bool)(CodedOutputStream::default_serialization_deterministic_ & 1);
  local_50._0_1_ = false;
  local_50._1_1_ = false;
  local_4d = false;
  local_88 = (undefined1  [8])local_78;
  local_80 = local_78;
  local_58 = &local_38;
  local_48 = local_78;
  local_40 = ArrayOutputStream::ByteCount(&local_38);
  bVar1 = ArrayOutputStream::Next(&local_38,(void **)local_b0,(int *)&local_c8);
  if (bVar1 && 0 < (int)(uint)local_c8.data_) {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)local_b0 + -0x10);
    if ((uint)local_c8.data_ < 0x11) {
      paVar7 = local_78;
    }
    local_88 = (undefined1  [8])(paVar7->_M_local_buf + (uint)local_c8.data_);
    local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_b0;
    local_48 = local_78;
    if ((uint)local_c8.data_ >= 0x11) {
      local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_b0;
    }
  }
  uVar6 = (pPVar2->
          super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
          super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>.
          _M_head_impl.value;
  paVar7 = local_48;
  if ((ulong)local_88 <= local_48) {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)EpsCopyOutputStream::EnsureSpaceFallback
                          ((EpsCopyOutputStream *)local_88,
                           (uint8_t *)&local_48->_M_allocated_capacity);
  }
  uVar5 = uVar6;
  if (0x7f < uVar6) {
    do {
      paVar7->_M_local_buf[0] = (byte)uVar5 | 0x80;
      uVar6 = uVar5 >> 7;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)paVar7 + 1);
      bVar1 = 0x3fff < uVar5;
      uVar5 = uVar6;
    } while (bVar1);
  }
  paVar7->_M_local_buf[0] = (byte)uVar6;
  local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar7 + 1);
  bVar1 = CodedOutputStream::HadError((CodedOutputStream *)local_88);
  local_c8.data_._0_4_ = CONCAT31(local_c8.data_._1_3_,!bVar1);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)&local_c8,(AssertionResult *)"coded_output.HadError()"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x125,(char *)local_b0);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_b0 != (undefined1  [8])&local_a0) {
      operator_delete((void *)local_b0,local_a0._M_allocated_capacity + 1);
    }
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
  }
  iVar4 = EpsCopyOutputStream::ByteCount((EpsCopyOutputStream *)local_88,(uint8_t *)local_48);
  lhs = &(pPVar2->
         super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
         super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>.
         _M_head_impl.size;
  local_c8.data_._0_4_ = (int)iVar4 - (int)local_40;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_b0,"kVarintCases_case.size","coded_output.ByteCount()",lhs,
             (int *)&local_c8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar8 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x127,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)CONCAT44(local_c8.data_._4_4_,(uint)local_c8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c8.data_._4_4_,(uint)local_c8.data_) + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_88);
  local_b0 = (undefined1  [8])ArrayOutputStream::ByteCount(&local_38);
  testing::internal::CmpHelperEQ<unsigned_long,long>
            ((internal *)local_88,"kVarintCases_case.size","output.ByteCount()",lhs,(long *)local_b0
            );
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (local_80 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar8 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar8 = (char *)local_80->_M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x12a,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  if (local_80 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  }
  local_b0 = (undefined1  [8])((ulong)local_b0 & 0xffffffff00000000);
  local_c8.data_._0_4_ =
       memcmp(&io::(anonymous_namespace)::CodedStreamTest::buffer_,
              &(pPVar2->
               super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>)
               .
               super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>
              ,*lhs);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_88,"0",
             "memcmp(buffer_, kVarintCases_case.bytes, kVarintCases_case.size)",(int *)local_b0,
             (int *)&local_c8);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (local_80 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar8 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar8 = (char *)local_80->_M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,300,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  if (local_80 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  }
  return;
}

Assistant:

TEST_P(VarintCasesWithSizes, WriteVarint64) {
  const VarintCase& kVarintCases_case = std::get<0>(GetParam());
  const int& kBlockSizes_case = std::get<1>(GetParam());
  ArrayOutputStream output(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedOutputStream coded_output(&output);

    coded_output.WriteVarint64(kVarintCases_case.value);
    EXPECT_FALSE(coded_output.HadError());

    EXPECT_EQ(kVarintCases_case.size, coded_output.ByteCount());
  }

  EXPECT_EQ(kVarintCases_case.size, output.ByteCount());
  EXPECT_EQ(0,
            memcmp(buffer_, kVarintCases_case.bytes, kVarintCases_case.size));
}